

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansend.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  uchar dlc;
  int iVar2;
  int __fd;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  int enable_canfx;
  can_raw_vcid_options vcid_opts;
  sockaddr_can addr;
  ifreq ifr;
  undefined4 local_70;
  undefined4 local_6c;
  sockaddr local_68;
  undefined8 local_58;
  char local_48 [15];
  undefined1 local_39;
  uint local_38;
  
  local_70 = 1;
  local_6c = 2;
  if (argc != 3) {
    main_cold_1();
    return 1;
  }
  iVar2 = parse_canframe(argv[2],&main::cu);
  if (iVar2 == 0) {
    main_cold_2();
    return 1;
  }
  __fd = socket(0x1d,3,1);
  if (__fd < 0) {
    pcVar5 = "socket";
LAB_001014bc:
    perror(pcVar5);
    return 1;
  }
  strncpy(local_48,argv[1],0xf);
  local_39 = 0;
  local_38 = if_nametoindex(local_48);
  if (local_38 == 0) {
    pcVar5 = "if_nametoindex";
  }
  else {
    local_68.sa_data[6] = '\0';
    local_68.sa_data[7] = '\0';
    local_68.sa_data[8] = '\0';
    local_68.sa_data[9] = '\0';
    local_68.sa_data[10] = '\0';
    local_68.sa_data[0xb] = '\0';
    local_68.sa_data[0xc] = '\0';
    local_68.sa_data[0xd] = '\0';
    local_58 = 0;
    local_68.sa_data._2_4_ = local_38;
    local_68._0_4_ = 0x1d;
    if (0x10 < iVar2) {
      iVar3 = ioctl(__fd,0x8921,local_48);
      uVar1 = local_38;
      if (iVar3 < 0) {
        pcVar5 = "SIOCGIFMTU";
        goto LAB_001014d3;
      }
      if ((local_38 == 0x48) && (iVar3 = setsockopt(__fd,0x65,5,&local_70,4), iVar3 != 0)) {
        pcVar5 = "error when enabling CAN FD support";
        goto LAB_00101422;
      }
      if (0x4b < (int)uVar1) {
        iVar3 = setsockopt(__fd,0x65,7,&local_70,4);
        if (iVar3 != 0) {
          pcVar5 = "error when enabling CAN XL support";
LAB_00101422:
          puts(pcVar5);
          return 1;
        }
        iVar3 = setsockopt(__fd,0x65,8,&local_6c,4);
        if (iVar3 != 0) {
          pcVar5 = "error when enabling CAN XL VCID pass through";
          goto LAB_00101422;
        }
      }
    }
    if (iVar2 == 0x80c) {
      iVar2 = main::cu.xl.len + 0xc;
    }
    else if (iVar2 == 0x48) {
      dlc = can_fd_len2dlc(main::cu.fd.len);
      main::cu.fd.len = can_fd_dlc2len(dlc);
    }
    setsockopt(__fd,0x65,1,(void *)0x0,0);
    iVar3 = bind(__fd,&local_68,0x18);
    if (iVar3 < 0) {
      pcVar5 = "bind";
      goto LAB_001014bc;
    }
    sVar4 = write(__fd,&main::cu,(long)iVar2);
    if (sVar4 == (long)iVar2) {
      close(__fd);
      return 0;
    }
    pcVar5 = "write";
  }
LAB_001014d3:
  perror(pcVar5);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
	int s; /* can raw socket */
	int required_mtu;
	int mtu;
	int enable_canfx = 1;
	struct sockaddr_can addr;
	struct can_raw_vcid_options vcid_opts = {
		.flags = CAN_RAW_XL_VCID_TX_PASS,
	};
	static cu_t cu;
	struct ifreq ifr;

	/* check command line options */
	if (argc != 3) {
		print_usage(argv[0]);
		return 1;
	}

	/* parse CAN frame */
	required_mtu = parse_canframe(argv[2], &cu);
	if (!required_mtu) {
		fprintf(stderr, "\nWrong CAN-frame format!\n\n");
		print_usage(argv[0]);
		return 1;
	}

	/* open socket */
	if ((s = socket(PF_CAN, SOCK_RAW, CAN_RAW)) < 0) {
		perror("socket");
		return 1;
	}

	strncpy(ifr.ifr_name, argv[1], IFNAMSIZ - 1);
	ifr.ifr_name[IFNAMSIZ - 1] = '\0';
	ifr.ifr_ifindex = if_nametoindex(ifr.ifr_name);
	if (!ifr.ifr_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	memset(&addr, 0, sizeof(addr));
	addr.can_family = AF_CAN;
	addr.can_ifindex = ifr.ifr_ifindex;

	if (required_mtu > (int)CAN_MTU) {
		/* check if the frame fits into the CAN netdevice */
		if (ioctl(s, SIOCGIFMTU, &ifr) < 0) {
			perror("SIOCGIFMTU");
			return 1;
		}
		mtu = ifr.ifr_mtu;

		if (mtu == (int)CANFD_MTU) {
			/* interface is ok - try to switch the socket into CAN FD mode */
			if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES,
				       &enable_canfx, sizeof(enable_canfx))){
				printf("error when enabling CAN FD support\n");
				return 1;
			}
		}

		if (mtu >= (int)CANXL_MIN_MTU) {
			/* interface is ok - try to switch the socket into CAN XL mode */
			if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_XL_FRAMES,
				       &enable_canfx, sizeof(enable_canfx))){
				printf("error when enabling CAN XL support\n");
				return 1;
			}
			/* try to enable the CAN XL VCID pass through mode */
			if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_XL_VCID_OPTS,
				       &vcid_opts, sizeof(vcid_opts))) {
				printf("error when enabling CAN XL VCID pass through\n");
				return 1;
			}
		}
	}

	/* ensure discrete CAN FD length values 0..8, 12, 16, 20, 24, 32, 64 */
	if (required_mtu == CANFD_MTU)
		cu.fd.len = can_fd_dlc2len(can_fd_len2dlc(cu.fd.len));

	/* CAN XL frames need real frame length for sending */
	if (required_mtu == CANXL_MTU)
		required_mtu = CANXL_HDR_SIZE + cu.xl.len;

	/*
	 * disable default receive filter on this RAW socket This is
	 * obsolete as we do not read from the socket at all, but for
	 * this reason we can remove the receive list in the Kernel to
	 * save a little (really a very little!) CPU usage.
	 */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0);

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	/* send frame */
	if (write(s, &cu, required_mtu) != required_mtu) {
		perror("write");
		return 1;
	}

	close(s);

	return 0;
}